

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::ColorPicker4(char *label,float *col,ImGuiColorEditFlags flags,float *ref_col)

{
  long lVar1;
  ImGuiID IVar2;
  ImU32 col_bot_right;
  int iVar3;
  ImGuiWindow *pIVar4;
  ImDrawList *this;
  ImGuiWindow *pIVar5;
  ImVec2 *pIVar6;
  ImDrawVert *pIVar7;
  ImDrawIdx *pIVar8;
  float fVar9;
  ImVec2 IVar10;
  ImGuiContext *pIVar11;
  ImGuiContext *pIVar12;
  undefined8 __src;
  bool bVar13;
  uint uVar14;
  uint uVar15;
  float fVar16;
  ImU32 col_00;
  int iVar17;
  ulong uVar18;
  ImVec2 *__dest;
  undefined8 extraout_RAX;
  ImU32 col_upr_left;
  undefined4 uVar19;
  long lVar20;
  char *text_end;
  char cVar21;
  int iVar22;
  ImGuiContext *g;
  ImVec2 IVar28;
  ImVec2 IVar29;
  ImVec2 pos;
  float fVar26;
  float fVar27;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  ImVec2 pos_00;
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  ImVec2 IVar30;
  uint uVar23;
  float fVar24;
  float fVar25;
  float fVar33;
  undefined1 auVar31 [12];
  float extraout_XMM0_Dc;
  undefined1 auVar32 [12];
  undefined1 extraout_var [12];
  float extraout_XMM0_Dd;
  float fVar34;
  float fVar35;
  ImVec2 p_max;
  ImVec2 p_max_00;
  ImVec2 half_sz;
  ImVec2 gradient_p1;
  ImVec2 half_sz_00;
  undefined1 auVar36 [12];
  uint uVar39;
  uint uVar40;
  uint uVar41;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar47;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar48 [16];
  ImVec2 picker_size;
  ImVec2 picker_pos;
  ImVec2 tra;
  ImVec2 triangle_pc;
  ImVec2 triangle_pa;
  float backup_initial_col [4];
  ImVec2 trc;
  ImVec2 trb;
  uint local_264;
  ImVec2 local_258;
  ImVec2 local_248;
  uint local_208;
  ImVec4 local_1e8;
  ImVec2 local_1d8;
  float local_1cc;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  ImVec2 local_190;
  undefined1 local_188 [8];
  undefined4 uStack_180;
  undefined4 uStack_17c;
  ImVec2 local_170;
  undefined1 local_168 [8];
  ImVec2 local_160;
  ImVec2 local_158;
  ImVec2 local_150;
  undefined1 local_148 [16];
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [8];
  float fStack_120;
  float fStack_11c;
  ImVec2 local_110;
  ImVec2 local_108;
  size_t local_100;
  float local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined1 local_e8 [16];
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  uint uStack_c4;
  uint uStack_c0;
  uint uStack_bc;
  undefined8 local_b8;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined1 local_a8 [16];
  float local_98 [3];
  undefined1 auStack_8c [4];
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar11 = GImGui;
  local_a8._8_8_ = local_a8._0_8_;
  pIVar4 = GImGui->CurrentWindow;
  pIVar4->WriteAccessed = true;
  this = pIVar4->DrawList;
  local_b8 = label;
  PushID(label);
  BeginGroup();
  uVar23 = (uint)~flags >> 4 & 0x10 | flags;
  local_a8._0_8_ = ref_col;
  if ((flags & 8U) == 0) {
    if ((flags & 0x6000000U) == 0 || (flags & 0x10002U) == 0) {
      bVar13 = BeginPopup("context",0);
      pIVar12 = GImGui;
      if (bVar13) {
        if ((flags & 0x6000000U) == 0) {
          local_128._0_4_ = flags;
          local_1e8.x = GImGui->FontSize * 8.0;
          fVar16 = (GImGui->Style).FramePadding.y;
          local_1e8.y = local_1e8.x -
                        (fVar16 + fVar16 + GImGui->FontSize + (GImGui->Style).ItemInnerSpacing.x);
          if (local_1e8.y <= 1.0) {
            local_1e8.y = 1.0;
          }
          PushItemWidth(local_1e8.x);
          bVar13 = false;
          iVar17 = 1;
          iVar22 = 0;
          do {
            if (bVar13) {
              Separator();
            }
            PushID(iVar22);
            cVar21 = (char)iVar17;
            uVar15 = (uint)bVar13 * 0x4000000 + iVar17 * 0x2000000 + (flags & 2U) + 0x1a8;
            IVar28 = (GImGui->CurrentWindow->DC).CursorPos;
            bVar13 = Selectable("##selectable",false,0,(ImVec2 *)&local_1e8);
            if (bVar13) {
              pIVar12->ColorEditOptions =
                   uVar15 & 0x6000000 | pIVar12->ColorEditOptions & 0xf9ffffffU;
            }
            pIVar5 = GImGui->CurrentWindow;
            pIVar5->WriteAccessed = true;
            (pIVar5->DC).CursorPos = IVar28;
            IVar29 = (pIVar5->DC).CursorMaxPos;
            fVar16 = IVar29.x;
            fVar24 = IVar29.y;
            uVar14 = -(uint)(IVar28.x <= fVar16);
            uVar39 = -(uint)(IVar28.y <= fVar24);
            (pIVar5->DC).CursorMaxPos =
                 (ImVec2)(CONCAT44(~uVar39 & (uint)IVar28.y,~uVar14 & (uint)IVar28.x) |
                         CONCAT44((uint)fVar24 & uVar39,(uint)fVar16 & uVar14));
            uVar18 = (ulong)((uVar15 & 2) == 0);
            memset(auStack_8c + uVar18 * 4,0,(ulong)((uVar15 & 2) * 2));
            memcpy(local_98,col,uVar18 * 4 + 0xc);
            ColorPicker4("##dummypicker",local_98,uVar15,(float *)0x0);
            PopID();
            iVar22 = 1;
            bVar13 = true;
            iVar17 = 0;
          } while (cVar21 != '\0');
          PopItemWidth();
          flags = local_128._0_4_;
          if ((_local_128 & (undefined1  [16])0x10002) == (undefined1  [16])0x0) {
            Separator();
            goto LAB_0018504e;
          }
        }
        else if ((flags & 0x10002U) == 0) {
LAB_0018504e:
          CheckboxFlags("Alpha Bar",(uint *)&pIVar12->ColorEditOptions,0x10000);
        }
        EndPopup();
      }
      goto LAB_0018506e;
    }
  }
  else {
LAB_0018506e:
    if ((flags & 0x6000000U) == 0) {
      uVar14 = pIVar11->ColorEditOptions & 0x6000000;
      uVar15 = 0x2000000;
      if (uVar14 != 0) {
        uVar15 = uVar14;
      }
      uVar23 = uVar23 | uVar15;
    }
  }
  uVar15 = (uVar23 & 0x6000000) - 1;
  if ((uVar23 & 0x6000000 ^ uVar15) <= uVar15) {
    __assert_fail("ImIsPowerOfTwo((int)(flags & ImGuiColorEditFlags__PickerMask))",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x2f9b,
                  "bool ImGui::ColorPicker4(const char *, float *, ImGuiColorEditFlags, const float *)"
                 );
  }
  if ((uVar23 & 8) == 0) {
    uVar23 = uVar23 | pIVar11->ColorEditOptions & 0x10000U;
  }
  uVar15 = uVar23 & 0x10002;
  IVar28 = (pIVar4->DC).CursorPos;
  fVar16 = (GImGui->Style).FramePadding.y;
  local_1c8 = ZEXT416((uint)(fVar16 + fVar16 + GImGui->FontSize));
  local_190 = IVar28;
  fVar24 = CalcItemWidth();
  fVar16 = (pIVar11->Style).ItemInnerSpacing.x;
  local_1a8 = ZEXT416((uint)fVar16);
  fVar24 = fVar24 - ((float)local_1c8._0_4_ + fVar16) * (float)(byte)((uVar15 == 0x10000) + 1);
  uVar14 = -(uint)(fVar24 <= (float)local_1c8._0_4_);
  uVar39 = extraout_var._0_4_ & local_1c8._4_4_;
  uVar40 = extraout_var._4_4_ & local_1c8._8_4_;
  uVar41 = extraout_var._8_4_ & local_1c8._12_4_;
  fVar42 = (float)(~uVar14 & (uint)fVar24 | uVar14 & local_1c8._0_4_);
  local_100 = (ulong)((uVar23 & 2) == 0) * 4 + 0xc;
  memcpy(local_98,col,local_100);
  fVar25 = fVar42 * 0.08;
  local_e8 = ZEXT416((uint)(fVar42 * 0.5));
  local_150.x = fVar42 * 0.5 - fVar25;
  _local_128 = ZEXT416((uint)local_150.x);
  fVar35 = IVar28.x;
  fVar43 = ((float)local_1c8._0_4_ + fVar42) * 0.5 + fVar35;
  fVar33 = IVar28.y;
  fVar47 = fVar42 * 0.5 + fVar33;
  local_150.x = local_150.x - (float)(int)(fVar42 * 0.027);
  local_150.y = 0.0;
  local_158.x = local_150.x * -0.5;
  local_108.y = local_150.x * -0.866025;
  fStack_80 = local_150.x * 0.0;
  fStack_7c = local_150.x * 0.0;
  local_158.y = local_150.x * 0.866025;
  local_78 = ZEXT416((uint)local_158.y);
  fVar16 = *col;
  fVar24 = col[1];
  fVar44 = col[2];
  fVar27 = fVar24;
  fVar26 = fVar44;
  if (fVar44 <= fVar24) {
    fVar27 = fVar44;
    fVar26 = fVar24;
  }
  fVar34 = (float)(-(uint)(fVar24 < fVar44) & 0xbf800000);
  fVar24 = fVar16;
  fVar44 = fVar26;
  if (fVar26 <= fVar16) {
    fVar24 = fVar26;
    fVar44 = fVar16;
  }
  fVar9 = fVar24;
  if (fVar27 <= fVar24) {
    fVar9 = fVar27;
  }
  local_148 = ZEXT416((uint)fVar44);
  _local_188 = ZEXT416((uint)((fVar44 - fVar9) / (fVar44 + 1e-20)));
  local_c8 = fVar42 + fVar35;
  IVar29.x = (float)local_1a8._0_4_ + local_c8;
  p_max_00.x = (float)local_1c8._0_4_ + IVar29.x;
  local_1b8 = ZEXT416((uint)ABS((fVar24 - fVar27) / ((fVar44 - fVar9) * 6.0 + 1e-20) +
                                (float)(-(uint)(fVar16 < fVar26) & (uint)(-0.33333334 - fVar34) |
                                       ~-(uint)(fVar16 < fVar26) & (uint)fVar34)));
  local_1d8.x = fVar43;
  local_1d8.y = fVar47;
  local_1cc = fVar35;
  local_108.x = local_158.x;
  local_d8 = local_150.x;
  fStack_d4 = local_150.x;
  fStack_d0 = local_150.x;
  fStack_cc = local_150.x;
  uStack_c4 = uVar39;
  uStack_c0 = uVar40;
  uStack_bc = uVar41;
  local_88 = local_158.x;
  fStack_84 = local_108.y;
  PushItemFlag(8,true);
  if ((uVar23 >> 0x1a & 1) == 0) {
    if ((uVar23 >> 0x19 & 1) != 0) {
      local_1e8.y = fVar42;
      local_1e8.x = fVar42;
      InvisibleButton("sv",(ImVec2 *)&local_1e8);
      IVar2 = GImGui->ActiveId;
      uStack_180 = local_188._4_4_;
      local_188._4_4_ = local_148._0_4_;
      uStack_17c = local_148._4_4_;
      if ((IVar2 == 0) || (IVar2 != (GImGui->CurrentWindow->DC).LastItemId)) {
        local_208 = 0;
      }
      else {
        auVar45._0_4_ = fVar42 + -1.0;
        IVar30 = (pIVar11->IO).MousePos;
        auVar37._0_4_ = IVar30.x - fVar35;
        auVar37._4_4_ = IVar30.y - fVar33;
        auVar37._8_8_ = 0;
        auVar45._4_4_ = auVar45._0_4_;
        auVar45._8_4_ = auVar45._0_4_;
        auVar45._12_4_ = auVar45._0_4_;
        auVar45 = divps(auVar37,auVar45);
        fVar24 = auVar45._0_4_;
        fVar16 = 1.0;
        if (fVar24 <= 1.0) {
          fVar16 = fVar24;
        }
        fVar27 = auVar45._4_4_;
        fVar44 = 1.0;
        if (fVar27 <= 1.0) {
          fVar44 = fVar27;
        }
        local_188._4_4_ =
             -(uint)(fVar27 < 0.0) & 0x3f800000 | ~-(uint)(fVar27 < 0.0) & (uint)(1.0 - fVar44);
        local_188._0_4_ = ~-(uint)(fVar24 < 0.0) & (uint)fVar16;
        _uStack_180 = 0;
        local_208 = (uint)CONCAT71((uint7)(uint3)(IVar2 >> 8),1);
      }
      if ((uVar23 & 8) == 0) {
        OpenPopupOnItemClick("context",1);
      }
      pIVar4 = GImGui->CurrentWindow;
      pIVar4->WriteAccessed = true;
      (pIVar4->DC).CursorPos = (ImVec2)((ulong)(uint)IVar29.x | (ulong)IVar28 & 0xffffffff00000000);
      IVar30 = (pIVar4->DC).CursorMaxPos;
      fVar16 = IVar30.x;
      fVar24 = IVar30.y;
      uVar14 = -(uint)(IVar29.x <= fVar16);
      uVar39 = -(uint)(fVar33 <= fVar24);
      (pIVar4->DC).CursorMaxPos =
           (ImVec2)(CONCAT44(~uVar39 & (uint)fVar33,~uVar14 & (uint)IVar29.x) |
                   CONCAT44((uint)fVar24 & uVar39,(uint)fVar16 & uVar14));
      local_1e8.x = (float)local_1c8._0_4_;
      InvisibleButton("hue",(ImVec2 *)&local_1e8);
      local_148._4_4_ = local_188._4_4_;
      local_148._0_4_ = local_188._4_4_;
      local_148._8_4_ = local_188._4_4_;
      local_148._12_4_ = local_188._4_4_;
      if ((GImGui->ActiveId == 0) || (GImGui->ActiveId != (GImGui->CurrentWindow->DC).LastItemId)) {
        local_264._0_1_ = '\0';
        uVar18 = (ulong)local_208;
        goto LAB_0018571b;
      }
      fVar16 = ((pIVar11->IO).MousePos.y - fVar33) / (fVar42 + -1.0);
      auVar31 = ZEXT812(0x3f800000);
      if (fVar16 <= 1.0) {
        auVar31._4_8_ = 0;
        auVar31._0_4_ = fVar16;
      }
      local_1b8._0_4_ = ~-(uint)(fVar16 < 0.0) & auVar31._0_4_;
      local_1b8._4_4_ = 0;
      local_1b8._8_4_ = auVar31._8_4_;
      local_1b8._12_4_ = 0;
      local_264._0_1_ = '\x01';
      uVar18 = CONCAT71((int7)((ulong)pIVar11 >> 8),1);
      goto LAB_00185728;
    }
    local_208._0_1_ = '\0';
    local_264._0_1_ = '\0';
    uVar18 = 0;
  }
  else {
    local_1e8.y = fVar42;
    local_1e8.x = (pIVar11->Style).ItemInnerSpacing.x + fVar42 + (float)local_1c8._0_4_;
    InvisibleButton("hsv",(ImVec2 *)&local_1e8);
    if ((GImGui->ActiveId == 0) || (GImGui->ActiveId != (GImGui->CurrentWindow->DC).LastItemId)) {
      local_208 = 0;
      local_264 = 0;
      uVar18 = 0;
    }
    else {
      local_f8 = (pIVar11->IO).MouseClickedPos[0].x - fVar43;
      local_138 = (pIVar11->IO).MouseClickedPos[0].y - fVar47;
      fVar43 = (pIVar11->IO).MousePos.x - fVar43;
      local_58 = ZEXT416((uint)fVar43);
      fVar47 = (pIVar11->IO).MousePos.y - fVar47;
      local_68 = ZEXT416((uint)fVar47);
      fStack_134 = 0.0;
      fStack_130 = 0.0;
      fStack_12c = 0.0;
      uStack_f4 = 0;
      uStack_f0 = 0;
      uStack_ec = 0;
      fVar16 = local_f8 * local_f8 + local_138 * local_138;
      if ((fVar16 < ((float)local_128._0_4_ + -1.0) * ((float)local_128._0_4_ + -1.0)) ||
         (((float)local_e8._0_4_ + 1.0) * ((float)local_e8._0_4_ + 1.0) < fVar16)) {
        local_264 = 0;
      }
      else {
        fVar16 = atan2f(fVar47,fVar43);
        fVar16 = (fVar16 / 3.1415927) * 0.5;
        local_1b8 = ZEXT416(~-(uint)(fVar16 < 0.0) & (uint)fVar16 |
                            (uint)(fVar16 + 1.0) & -(uint)(fVar16 < 0.0));
        local_264 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      }
      fVar16 = (float)local_1b8._0_4_ * -2.0 * 3.1415927;
      fVar24 = cosf(fVar16);
      fVar16 = sinf(fVar16);
      local_1e8.x = fVar24 * local_f8 + -local_138 * fVar16;
      local_1e8.y = fVar16 * local_f8 + fVar24 * local_138;
      local_138 = fVar16;
      fStack_134 = extraout_XMM0_Db_02;
      fStack_130 = extraout_XMM0_Dc;
      fStack_12c = extraout_XMM0_Dd;
      bVar13 = ImTriangleContainsPoint(&local_150,&local_108,&local_158,(ImVec2 *)&local_1e8);
      if (bVar13) {
        fStack_130 = fStack_134 * -(float)local_68._4_4_;
        fStack_134 = local_138 * (float)local_58._0_4_;
        local_138 = fVar24 * (float)local_58._0_4_ + local_138 * -(float)local_68._0_4_;
        fStack_134 = fStack_134 + (float)local_68._0_4_ * fVar24;
        fStack_130 = -(float)local_68._4_4_ * (float)local_58._0_4_ + fStack_130;
        fStack_12c = extraout_XMM0_Db_01 * (float)local_58._0_4_ +
                     (float)local_68._4_4_ * extraout_XMM0_Db_01;
        local_1e8.y = fStack_134;
        local_1e8.x = local_138;
        bVar13 = ImTriangleContainsPoint(&local_150,&local_108,&local_158,(ImVec2 *)&local_1e8);
        if (bVar13) {
          IVar30.y = fStack_134;
          IVar30.x = local_138;
        }
        else {
          IVar30 = ImTriangleClosestPoint(&local_150,&local_108,&local_158,(ImVec2 *)&local_1e8);
        }
        fVar16 = IVar30.x - local_d8;
        fVar24 = local_88 - fStack_d4;
        fVar44 = (float)local_78._0_4_ * fVar24 - fStack_84 * fVar24;
        auVar32 = ZEXT812(0x3f800000);
        fVar27 = 1.0 - ((float)local_78._0_4_ * fVar16 - IVar30.y * fVar24) / fVar44;
        auVar36 = ZEXT812(0x3f800000);
        if (fVar27 <= 1.0) {
          auVar36._4_8_ = 0;
          auVar36._0_4_ = fVar27;
        }
        local_148._0_4_ =
             -(uint)(fVar27 < 0.0001) & 0x38d1b717 | ~-(uint)(fVar27 < 0.0001) & auVar36._0_4_;
        local_148._4_4_ = 0;
        local_148._8_4_ = auVar36._8_4_;
        local_148._12_4_ = 0;
        fVar16 = (fVar27 - (fVar24 * IVar30.y - fStack_84 * fVar16) / fVar44) /
                 (float)local_148._0_4_;
        if (fVar16 <= 1.0) {
          auVar32._4_8_ = 0;
          auVar32._0_4_ = fVar16;
        }
        local_188._4_4_ = 0;
        local_188._0_4_ =
             -(uint)(fVar16 < 0.0001) & 0x38d1b717 | ~-(uint)(fVar16 < 0.0001) & auVar32._0_4_;
        uStack_180 = auVar32._8_4_;
        uStack_17c = 0;
        local_208 = 1;
        uVar18 = 1;
      }
      else {
        local_208 = 0;
        uVar18 = (ulong)local_264;
      }
    }
    if ((uVar23 & 8) == 0) {
      OpenPopupOnItemClick("context",1);
    }
LAB_0018571b:
LAB_00185728:
  }
  local_1a8._0_4_ = (float)local_1a8._0_4_ + p_max_00.x;
  if (uVar15 == 0x10000) {
    pIVar4 = GImGui->CurrentWindow;
    pIVar4->WriteAccessed = true;
    (pIVar4->DC).CursorPos =
         (ImVec2)((ulong)(uint)local_1a8._0_4_ | (ulong)IVar28 & 0xffffffff00000000);
    IVar28 = (pIVar4->DC).CursorMaxPos;
    fVar16 = IVar28.x;
    fVar24 = IVar28.y;
    uVar14 = -(uint)((float)local_1a8._0_4_ <= fVar16);
    uVar39 = -(uint)(fVar33 <= fVar24);
    (pIVar4->DC).CursorMaxPos =
         (ImVec2)(CONCAT44(~uVar39 & (uint)fVar33,~uVar14 & local_1a8._0_4_) |
                 CONCAT44((uint)fVar24 & uVar39,(uint)fVar16 & uVar14));
    local_1e8.y = fVar42;
    local_1e8.x = (float)local_1c8._0_4_;
    InvisibleButton("alpha",(ImVec2 *)&local_1e8);
    if (GImGui->ActiveId == 0) goto LAB_00185845;
    uVar18 = uVar18 & 0xffffffff;
    if (GImGui->ActiveId == (GImGui->CurrentWindow->DC).LastItemId) {
      fVar24 = ((pIVar11->IO).MousePos.y - fVar33) / (fVar42 + -1.0);
      fVar16 = 1.0;
      if (fVar24 <= 1.0) {
        fVar16 = fVar24;
      }
      col[3] = (float)(-(uint)(fVar24 < 0.0) & 0x3f800000 |
                      ~-(uint)(fVar24 < 0.0) & (uint)(1.0 - fVar16));
      uVar18 = CONCAT71((int7)(uVar18 >> 8),1);
    }
  }
  else {
LAB_00185845:
    uVar18 = uVar18 & 0xffffffff;
  }
  PopItemFlag();
  pIVar12 = GImGui;
  __src = local_a8._0_8_;
  if ((uVar23 >> 8 & 1) == 0) {
    fVar16 = (pIVar11->Style).ItemInnerSpacing.x;
    pIVar4 = GImGui->CurrentWindow;
    pIVar4->WriteAccessed = true;
    if (pIVar4->SkipItems == false) {
      if (fVar16 < 0.0) {
        fVar16 = (pIVar12->Style).ItemSpacing.x;
      }
      (pIVar4->DC).CursorPos.x = fVar16 + (pIVar4->DC).CursorPosPrevLine.x;
      (pIVar4->DC).CursorPos.y = (pIVar4->DC).CursorPosPrevLine.y;
      (pIVar4->DC).CurrentLineHeight = (pIVar4->DC).PrevLineHeight;
      (pIVar4->DC).CurrentLineTextBaseOffset = (pIVar4->DC).PrevLineTextBaseOffset;
    }
    BeginGroup();
  }
  pIVar12 = GImGui;
  if ((local_b8 != (char *)0xffffffffffffffff) && (text_end = local_b8, (uVar23 & 0x80) == 0)) {
    do {
      if (*text_end == '#') {
        if (text_end[1] == '#') goto LAB_00185918;
      }
      else if (*text_end == '\0') goto LAB_00185918;
      text_end = text_end + 1;
    } while (text_end != (char *)0xffffffffffffffff);
    text_end = (char *)0xffffffffffffffff;
LAB_00185918:
    if (text_end != local_b8) {
      if ((uVar23 >> 8 & 1) != 0) {
        fVar16 = (pIVar11->Style).ItemInnerSpacing.x;
        pIVar4 = GImGui->CurrentWindow;
        pIVar4->WriteAccessed = true;
        if (pIVar4->SkipItems == false) {
          if (fVar16 < 0.0) {
            fVar16 = (pIVar12->Style).ItemSpacing.x;
          }
          (pIVar4->DC).CursorPos.x = fVar16 + (pIVar4->DC).CursorPosPrevLine.x;
          (pIVar4->DC).CursorPos.y = (pIVar4->DC).CursorPosPrevLine.y;
          (pIVar4->DC).CurrentLineHeight = (pIVar4->DC).PrevLineHeight;
          (pIVar4->DC).CurrentLineTextBaseOffset = (pIVar4->DC).PrevLineTextBaseOffset;
        }
      }
      TextUnformatted(local_b8,text_end);
    }
  }
  fVar16 = (float)local_1c8._0_4_;
  if ((uVar23 >> 8 & 1) == 0) {
    PushItemFlag(0x10,true);
    local_1e8.x = col[0];
    local_1e8.y = col[1];
    if ((uVar23 & 2) == 0) {
      local_1e8.w = col[3];
    }
    else {
      local_1e8.w = 1.0;
    }
    local_1e8.z = col[2];
    if ((char)uVar23 < '\0') {
      Text("Current");
    }
    IVar28.x = (float)local_1c8._0_4_ * 3.0;
    IVar28.y = (float)local_1c8._0_4_ * 2.0;
    ColorButton("##current",&local_1e8,uVar23 & 0xe0040,IVar28);
    if ((ImVec2 *)__src != (ImVec2 *)0x0) {
      Text("Original");
      local_168 = *(undefined1 (*) [8])__src;
      if ((uVar23 & 2) == 0) {
        local_160.y = ((ImVec2 *)(__src + 8))->y;
      }
      else {
        local_160.y = 1.0;
      }
      local_160.x = ((ImVec2 *)(__src + 8))->x;
      bVar13 = ColorButton("##original",(ImVec4 *)local_168,uVar23 & 0xe0040,IVar28);
      if (bVar13) {
        memcpy(col,(void *)__src,local_100);
        uVar18 = CONCAT71((int7)(uVar18 >> 8),1);
      }
    }
    PopItemFlag();
    EndGroup();
    fVar16 = (float)local_1c8._0_4_;
  }
  uVar19 = (undefined4)uVar18;
  if (((char)local_264 != '\0') || ((char)local_208 != '\0')) {
    ColorConvertHSVtoRGB
              ((float)(~-(uint)(1.0 <= (float)local_1b8._0_4_) & local_1b8._0_4_ |
                      (uint)((float)local_1b8._0_4_ + -1e-05) &
                      -(uint)(1.0 <= (float)local_1b8._0_4_)),
               (float)(~-(uint)(0.0 < (float)local_188._0_4_) & 0x3727c5ac |
                      -(uint)(0.0 < (float)local_188._0_4_) & local_188._0_4_),
               (float)(~-(uint)(0.0 < (float)local_148._0_4_) & 0x358637bd |
                      -(uint)(0.0 < (float)local_148._0_4_) & local_148._0_4_),col,col + 1,col + 2);
  }
  if ((uVar23 & 0x20) == 0) {
    fVar24 = (float)local_1a8._0_4_;
    if (uVar15 != 0x10000) {
      fVar24 = IVar29.x;
    }
    PushItemWidth((fVar24 + (float)local_1c8._0_4_) - local_1cc);
    uVar14 = uVar23 & 0x18e001a;
    if ((uVar23 >> 0x14 & 1) != 0 || (uVar23 & 0x600000) == 0) {
      bVar13 = ColorEdit4("##rgb",col,uVar14 | 0x100004);
      uVar18 = CONCAT71((int7)(uVar18 >> 8),(byte)uVar18 | bVar13);
    }
    if ((uVar23 >> 0x15 & 1) != 0 || (uVar23 & 0x500000) == 0) {
      bVar13 = ColorEdit4("##hsv",col,uVar14 | 0x200004);
      uVar18 = CONCAT71((int7)(uVar18 >> 8),(byte)uVar18 | bVar13);
    }
    uVar19 = (undefined4)uVar18;
    if ((uVar23 >> 0x16 & 1) != 0 || (uVar23 & 0x300000) == 0) {
      bVar13 = ColorEdit4("##hex",col,uVar14 | 0x400004);
      uVar19 = (undefined4)CONCAT71((int7)(uVar18 >> 8),(byte)uVar18 | bVar13);
    }
    PopItemWidth();
  }
  local_f8 = (float)(int)(fVar16 * 0.2);
  uStack_f4 = 0;
  uStack_f0 = 0;
  uStack_ec = 0;
  if ((char)uVar19 == '\0') goto LAB_00185da5;
  fVar16 = *col;
  fVar24 = col[1];
  fVar44 = col[2];
  fVar27 = fVar24;
  fVar26 = fVar44;
  if (fVar44 <= fVar24) {
    fVar27 = fVar44;
    fVar26 = fVar24;
  }
  fVar35 = (float)(-(uint)(fVar24 < fVar44) & 0xbf800000);
  fVar24 = fVar16;
  fVar44 = fVar26;
  if (fVar26 <= fVar16) {
    fVar24 = fVar26;
    fVar44 = fVar16;
  }
  fVar47 = fVar24;
  if (fVar27 <= fVar24) {
    fVar47 = fVar27;
  }
  if (((fVar24 - fVar27) / ((fVar44 - fVar47) * 6.0 + 1e-20) +
       (float)(-(uint)(fVar16 < fVar26) & (uint)(-0.33333334 - fVar35) |
              ~-(uint)(fVar16 < fVar26) & (uint)fVar35) != 0.0) || ((float)local_1b8._0_4_ <= 0.0))
  goto LAB_00185da5;
  if (0.0 < fVar44) {
LAB_00185d69:
    if (0.0 < (fVar44 - fVar47) / (fVar44 + 1e-20)) goto LAB_00185da5;
    fVar16 = (float)local_188._0_4_ * 0.5;
  }
  else {
    if (((float)local_148._0_4_ == fVar44) && (!NAN((float)local_148._0_4_) && !NAN(fVar44)))
    goto LAB_00185d69;
    fVar44 = (float)local_148._0_4_ * 0.5;
    fVar16 = (float)local_188._0_4_;
  }
  ColorConvertHSVtoRGB((float)local_1b8._0_4_,fVar16,fVar44,col,col + 1,col + 2);
LAB_00185da5:
  local_1e8.x = 1.0;
  local_1e8.y = 1.0;
  local_1e8.z = 1.0;
  local_1e8.w = 1.0;
  local_138 = (float)uVar19;
  ColorConvertHSVtoRGB((float)local_1b8._0_4_,1.0,1.0,&local_1e8.x,&local_1e8.y,&local_1e8.z);
  fVar16 = (float)ColorConvertFloat4ToU32(&local_1e8);
  local_168._0_4_ = col[0];
  local_168._4_4_ = col[1];
  local_160.y = 1.0;
  local_160.x = col[2];
  col_00 = ColorConvertFloat4ToU32((ImVec4 *)local_168);
  local_110.x = 0.0;
  local_110.y = 0.0;
  if ((uVar23 >> 0x1a & 1) == 0) {
    if ((uVar23 >> 0x19 & 1) != 0) {
      local_168._4_4_ = fVar33 + fVar42;
      local_168._0_4_ = local_c8;
      ImDrawList::AddRectFilledMultiColor
                (this,&local_190,(ImVec2 *)local_168,0xffffffff,(ImU32)fVar16,(ImU32)fVar16,
                 0xffffffff);
      local_168._0_4_ = local_190.x + fVar42;
      local_168._4_4_ = local_190.y + fVar42;
      ImDrawList::AddRectFilledMultiColor
                (this,&local_190,(ImVec2 *)local_168,0,0,0xff000000,0xff000000);
      p_max.x = fVar42 + local_190.x;
      p_max.y = fVar42 + local_190.y;
      RenderFrameBorder(local_190,p_max,0.0);
      auVar48._4_4_ = 1.0 - (float)local_148._0_4_;
      auVar48._0_4_ = local_188._0_4_;
      auVar48._8_4_ = local_188._4_4_;
      auVar48._12_4_ = 0;
      auVar45 = minps(_DAT_0019b110,auVar48);
      fVar16 = local_190.x;
      fVar24 = local_190.y;
      auVar38._0_4_ =
           (float)(int)((float)(-(uint)(0.0 <= (float)local_188._0_4_) & auVar45._0_4_) * fVar42 +
                        fVar16 + 0.5);
      auVar38._4_4_ =
           (float)(int)((float)(-(uint)(0.0 <= 1.0 - (float)local_148._0_4_) & auVar45._4_4_) *
                        fVar42 + fVar24 + 0.5);
      auVar38._8_4_ =
           (float)(int)((float)(-(uint)(0.0 <= (float)local_188._4_4_) & auVar45._8_4_) * fVar42 +
                        0.0 + 0.0);
      auVar38._12_4_ = (float)(int)(auVar45._12_4_ * fVar42 + 0.0 + 0.0);
      auVar46._0_4_ = fVar42 + fVar16 + -2.0;
      auVar46._4_4_ = fVar42 + fVar24 + -2.0;
      auVar46._8_4_ = fVar42 + 0.0 + 0.0;
      auVar46._12_4_ = fVar42 + 0.0 + 0.0;
      auVar45 = minps(auVar46,auVar38);
      uVar23 = -(uint)(auVar38._0_4_ < fVar16 + 2.0);
      uVar14 = -(uint)(auVar38._4_4_ < fVar24 + 2.0);
      local_110 = (ImVec2)(CONCAT44(~uVar14 & auVar45._4_4_,~uVar23 & auVar45._0_4_) |
                          CONCAT44((uint)(fVar24 + 2.0) & uVar14,(uint)(fVar16 + 2.0) & uVar23));
      lVar20 = 0;
      col_upr_left = 0xff0000ff;
      do {
        local_168._4_4_ = (float)(int)lVar20 * (fVar42 / 6.0) + local_190.y;
        local_168._0_4_ = IVar29.x;
        lVar1 = lVar20 + 1;
        local_170.y = (float)(int)lVar1 * (fVar42 / 6.0) + local_190.y;
        col_bot_right = (&DAT_001c55b4)[lVar20];
        local_170.x = p_max_00.x;
        ImDrawList::AddRectFilledMultiColor
                  (this,(ImVec2 *)local_168,&local_170,col_upr_left,col_upr_left,col_bot_right,
                   col_bot_right);
        lVar20 = lVar1;
        col_upr_left = col_bot_right;
      } while (lVar1 != 6);
      fVar16 = (float)local_1b8._0_4_ * fVar42 + local_190.y;
      IVar29.y = local_190.y;
      p_max_00.y = fVar42 + local_190.y;
      RenderFrameBorder(IVar29,p_max_00,0.0);
      pos.x = IVar29.x + -1.0;
      pos.y = (float)(int)(fVar16 + 0.5);
      half_sz.x = local_f8 + 1.0;
      half_sz.y = local_f8;
      RenderArrowsForVerticalBar(this,pos,half_sz,(float)local_1c8._0_4_ + 2.0);
    }
  }
  else {
    iVar17 = 4;
    if (4 < (int)(float)local_e8._0_4_ / 0xc) {
      iVar17 = (int)(float)local_e8._0_4_ / 0xc;
    }
    local_a8 = ZEXT416((uint)(1.5 / (float)local_e8._0_4_));
    local_b8 = (char *)CONCAT44(0x80000000,-(1.5 / (float)local_e8._0_4_));
    uStack_b0 = 0x80000000;
    uStack_ac = 0x80000000;
    local_e8._0_4_ = (float)local_e8._0_4_ + (float)local_128._0_4_;
    local_1cc = (float)local_e8._0_4_ * 0.5;
    local_128._4_4_ = local_128._0_4_;
    fStack_120 = (float)local_128._0_4_;
    fStack_11c = (float)local_128._0_4_;
    lVar20 = 0;
    local_c8 = fVar16;
    do {
      fVar16 = (float)(int)lVar20 / 6.0;
      fVar16 = (fVar16 + fVar16) * 3.1415927 + (float)local_b8;
      fVar24 = ((float)(int)lVar20 + 1.0) / 6.0;
      fVar24 = (fVar24 + fVar24) * 3.1415927 + (float)local_a8._0_4_;
      iVar22 = (this->VtxBuffer).Size;
      ImDrawList::PathArcTo(this,&local_1d8,local_1cc,fVar16,fVar24,iVar17);
      ImDrawList::AddPolyline(this,(this->_Path).Data,(this->_Path).Size,0xffffffff,false,fVar25);
      if ((this->_Path).Capacity < 0) {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
        __dest = (ImVec2 *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
        pIVar6 = (this->_Path).Data;
        if (pIVar6 != (ImVec2 *)0x0) {
          memcpy(__dest,pIVar6,(long)(this->_Path).Size << 3);
          pIVar6 = (this->_Path).Data;
          if (pIVar6 != (ImVec2 *)0x0) {
            GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
          }
          (*GImAllocatorFreeFunc)(pIVar6,GImAllocatorUserData);
        }
        (this->_Path).Data = __dest;
        (this->_Path).Capacity = 0;
      }
      fVar44 = local_1d8.x;
      (this->_Path).Size = 0;
      iVar3 = (this->VtxBuffer).Size;
      fVar26 = cosf(fVar16);
      fVar27 = local_1d8.y;
      fVar35 = sinf(fVar16);
      fVar16 = local_1d8.x;
      local_258.y = fVar35 * (float)local_128._4_4_ + fVar27;
      local_258.x = fVar26 * (float)local_128._0_4_ + fVar44;
      fVar27 = cosf(fVar24);
      fVar44 = local_1d8.y;
      fVar24 = sinf(fVar24);
      gradient_p1.x = fVar27 * (float)local_128._0_4_ + fVar16;
      gradient_p1.y = fVar24 * (float)local_128._4_4_ + fVar44;
      pIVar7 = (this->VtxBuffer).Data;
      lVar1 = lVar20 + 1;
      ShadeVertsLinearColorGradientKeepAlpha
                (pIVar7 + iVar22,pIVar7 + iVar3,local_258,gradient_p1,(&DAT_001c55b0)[lVar20],
                 (&DAT_001c55b4)[lVar20]);
      lVar20 = lVar1;
    } while (lVar1 != 6);
    local_1b8._0_4_ = ((float)local_1b8._0_4_ + (float)local_1b8._0_4_) * 3.1415927;
    fVar24 = cosf((float)local_1b8._0_4_);
    fVar44 = sinf((float)local_1b8._0_4_);
    fVar16 = local_c8;
    local_168._0_4_ = fVar24 * (float)local_e8._0_4_ * 0.5 + local_1d8.x;
    local_168._4_4_ = fVar44 * (float)local_e8._0_4_ * 0.5 + local_1d8.y;
    if ((char)local_264 == '\0') {
      fVar27 = 0.55;
    }
    else {
      fVar27 = 0.65;
    }
    fVar25 = fVar25 * fVar27;
    iVar17 = 0x20;
    if ((int)(fVar25 / 1.4) < 0x20) {
      iVar17 = (int)(fVar25 / 1.4);
    }
    iVar22 = 9;
    if (9 < iVar17) {
      iVar22 = iVar17;
    }
    ImDrawList::AddCircleFilled(this,(ImVec2 *)local_168,fVar25,(ImU32)local_c8,iVar22);
    ImDrawList::AddCircle(this,(ImVec2 *)local_168,fVar25 + 1.0,0xff808080,iVar22,1.0);
    ImDrawList::AddCircle(this,(ImVec2 *)local_168,fVar25,0xffffffff,iVar22,1.0);
    local_170.x = local_d8 * fVar24 + fVar44 * -0.0 + local_1d8.x;
    local_170.y = fStack_d4 * fVar44 + fVar24 * 0.0 + local_1d8.y;
    fStack_d0 = fStack_d0 * extraout_XMM0_Db_00 + extraout_XMM0_Db_00 * 0.0 + 0.0;
    fStack_cc = fStack_cc * extraout_XMM0_Db + extraout_XMM0_Db * 0.0 + 0.0;
    local_38.x = -fStack_84 * fVar44 + local_88 * fVar24 + local_1d8.x;
    local_38.y = fStack_84 * fVar24 + local_88 * fVar44 + local_1d8.y;
    local_248.y = local_38.y;
    local_248.x = local_38.x;
    local_258.x = -(float)local_78._0_4_ * fVar44 + local_88 * fVar24 + local_1d8.x;
    local_258.y = (float)local_78._0_4_ * fVar24 + local_88 * fVar44 + local_1d8.y;
    local_40.y = local_258.y;
    local_40.x = local_258.x;
    IVar28 = (GImGui->DrawListSharedData).TexUvWhitePixel;
    local_d8 = local_170.x;
    fStack_d4 = local_170.y;
    ImDrawList::PrimReserve(this,6,6);
    pIVar8 = this->_IdxWritePtr;
    *pIVar8 = (ImDrawIdx)this->_VtxCurrentIdx;
    this->_IdxWritePtr = pIVar8 + 1;
    IVar10.y = fStack_d4;
    IVar10.x = local_d8;
    this->_VtxWritePtr->pos = IVar10;
    this->_VtxWritePtr->uv = IVar28;
    pIVar7 = this->_VtxWritePtr;
    pIVar7->col = (ImU32)fVar16;
    this->_VtxWritePtr = pIVar7 + 1;
    uVar23 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar23;
    pIVar8 = this->_IdxWritePtr;
    *pIVar8 = (ImDrawIdx)uVar23;
    this->_IdxWritePtr = pIVar8 + 1;
    pIVar7[1].pos = local_248;
    this->_VtxWritePtr->uv = IVar28;
    pIVar7 = this->_VtxWritePtr;
    pIVar7->col = (ImU32)fVar16;
    this->_VtxWritePtr = pIVar7 + 1;
    uVar23 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar23;
    pIVar8 = this->_IdxWritePtr;
    *pIVar8 = (ImDrawIdx)uVar23;
    this->_IdxWritePtr = pIVar8 + 1;
    pIVar7[1].pos = local_258;
    this->_VtxWritePtr->uv = IVar28;
    pIVar7 = this->_VtxWritePtr;
    pIVar7->col = 0xffffffff;
    this->_VtxWritePtr = pIVar7 + 1;
    uVar23 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar23;
    pIVar8 = this->_IdxWritePtr;
    *pIVar8 = (ImDrawIdx)uVar23;
    this->_IdxWritePtr = pIVar8 + 1;
    pIVar7[1].pos = IVar10;
    this->_VtxWritePtr->uv = IVar28;
    pIVar7 = this->_VtxWritePtr;
    pIVar7->col = 0;
    this->_VtxWritePtr = pIVar7 + 1;
    uVar23 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar23;
    pIVar8 = this->_IdxWritePtr;
    *pIVar8 = (ImDrawIdx)uVar23;
    this->_IdxWritePtr = pIVar8 + 1;
    pIVar7[1].pos = local_248;
    this->_VtxWritePtr->uv = IVar28;
    pIVar7 = this->_VtxWritePtr;
    pIVar7->col = 0xff000000;
    this->_VtxWritePtr = pIVar7 + 1;
    uVar23 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar23;
    pIVar8 = this->_IdxWritePtr;
    *pIVar8 = (ImDrawIdx)uVar23;
    this->_IdxWritePtr = pIVar8 + 1;
    pIVar7[1].pos = local_40;
    this->_VtxWritePtr->uv = IVar28;
    pIVar7 = this->_VtxWritePtr;
    pIVar7->col = 0;
    this->_VtxWritePtr = pIVar7 + 1;
    this->_VtxCurrentIdx = this->_VtxCurrentIdx + 1;
    ImDrawList::AddTriangle(this,&local_170,&local_38,&local_40,0xff808080,1.5);
    fVar16 = 1.0;
    if ((float)local_188._0_4_ <= 1.0) {
      fVar16 = (float)local_188._0_4_;
    }
    fVar16 = (float)(~-(uint)((float)local_188._0_4_ < 0.0) & (uint)fVar16);
    fVar44 = 1.0 - (float)local_148._0_4_;
    fVar24 = 1.0;
    if (fVar44 <= 1.0) {
      fVar24 = fVar44;
    }
    fVar24 = (float)(~-(uint)(fVar44 < 0.0) & (uint)fVar24);
    fVar44 = fVar16 * (local_170.x - local_40.x) + local_40.x;
    fVar16 = fVar16 * (local_170.y - local_40.y) + local_40.y;
    local_110.x = fVar24 * (local_38.x - fVar44) + fVar44;
    local_110.y = fVar24 * (local_38.y - fVar16) + fVar16;
  }
  if ((char)local_208 == '\0') {
    fVar16 = 6.0;
  }
  else {
    fVar16 = 10.0;
  }
  ImDrawList::AddCircleFilled(this,&local_110,fVar16,col_00,0xc);
  ImDrawList::AddCircle(this,&local_110,fVar16 + 1.0,0xff808080,0xc,1.0);
  ImDrawList::AddCircle(this,&local_110,fVar16,0xffffffff,0xc,1.0);
  if (uVar15 == 0x10000) {
    fVar16 = col[3];
    fVar24 = 1.0;
    if (fVar16 <= 1.0) {
      fVar24 = fVar16;
    }
    local_168._4_4_ = local_190.y;
    local_168._0_4_ = local_1a8._0_4_;
    local_160.x = (float)local_1a8._0_4_ + (float)local_1c8._0_4_;
    local_160.y = local_190.y + fVar42;
    RenderColorRectWithAlphaCheckerboard
              ((ImVec2)local_168,local_160,0,(local_160.x - (float)local_1a8._0_4_) * 0.5,
               (ImVec2)0x0,0.0,-1);
    ImDrawList::AddRectFilledMultiColor
              (this,(ImVec2 *)local_168,&local_160,col_00,col_00,col_00 & 0xffffff,col_00 & 0xffffff
              );
    fVar16 = (float)(-(uint)(fVar16 < 0.0) & 0x3f800000 |
                    ~-(uint)(fVar16 < 0.0) & (uint)(1.0 - fVar24)) * fVar42 + local_190.y;
    RenderFrameBorder((ImVec2)local_168,local_160,0.0);
    pos_00.x = (float)local_1a8._0_4_ + -1.0;
    pos_00.y = (float)(int)(fVar16 + 0.5);
    half_sz_00.x = local_f8 + 1.0;
    half_sz_00.y = local_f8;
    RenderArrowsForVerticalBar(this,pos_00,half_sz_00,(float)local_1c8._0_4_ + 2.0);
  }
  EndGroup();
  PopID();
  if (local_138._0_1_ == '\0') {
    bVar13 = false;
  }
  else {
    iVar17 = bcmp(local_98,col,local_100);
    bVar13 = iVar17 != 0;
  }
  return bVar13;
}

Assistant:

bool ImGui::ColorPicker4(const char* label, float col[4], ImGuiColorEditFlags flags, const float* ref_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    ImDrawList* draw_list = window->DrawList;

    ImGuiStyle& style = g.Style;
    ImGuiIO& io = g.IO;

    PushID(label);
    BeginGroup();

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
        flags |= ImGuiColorEditFlags_NoSmallPreview;

    // Context menu: display and store options.
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        ColorPickerOptionsPopup(flags, col);

    // Read stored options
    if (!(flags & ImGuiColorEditFlags__PickerMask))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags__PickerMask) ? g.ColorEditOptions : ImGuiColorEditFlags__OptionsDefault) & ImGuiColorEditFlags__PickerMask;
    IM_ASSERT(ImIsPowerOfTwo((int)(flags & ImGuiColorEditFlags__PickerMask))); // Check that only 1 is selected
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags_AlphaBar);

    // Setup
    int components = (flags & ImGuiColorEditFlags_NoAlpha) ? 3 : 4;
    bool alpha_bar = (flags & ImGuiColorEditFlags_AlphaBar) && !(flags & ImGuiColorEditFlags_NoAlpha);
    ImVec2 picker_pos = window->DC.CursorPos;
    float square_sz = GetFrameHeight();
    float bars_width = square_sz; // Arbitrary smallish width of Hue/Alpha picking bars
    float sv_picker_size = ImMax(bars_width * 1, CalcItemWidth() - (alpha_bar ? 2 : 1) * (bars_width + style.ItemInnerSpacing.x)); // Saturation/Value picking box
    float bar0_pos_x = picker_pos.x + sv_picker_size + style.ItemInnerSpacing.x;
    float bar1_pos_x = bar0_pos_x + bars_width + style.ItemInnerSpacing.x;
    float bars_triangles_half_sz = (float)(int)(bars_width * 0.20f);

    float backup_initial_col[4];
    memcpy(backup_initial_col, col, components * sizeof(float));

    float wheel_thickness = sv_picker_size * 0.08f;
    float wheel_r_outer = sv_picker_size * 0.50f;
    float wheel_r_inner = wheel_r_outer - wheel_thickness;
    ImVec2 wheel_center(picker_pos.x + (sv_picker_size + bars_width)*0.5f, picker_pos.y + sv_picker_size*0.5f);

    // Note: the triangle is displayed rotated with triangle_pa pointing to Hue, but most coordinates stays unrotated for logic.
    float triangle_r = wheel_r_inner - (int)(sv_picker_size * 0.027f);
    ImVec2 triangle_pa = ImVec2(triangle_r, 0.0f); // Hue point.
    ImVec2 triangle_pb = ImVec2(triangle_r * -0.5f, triangle_r * -0.866025f); // Black point.
    ImVec2 triangle_pc = ImVec2(triangle_r * -0.5f, triangle_r * +0.866025f); // White point.

    float H,S,V;
    ColorConvertRGBtoHSV(col[0], col[1], col[2], H, S, V);

    bool value_changed = false, value_changed_h = false, value_changed_sv = false;

    PushItemFlag(ImGuiItemFlags_NoNav, true);
    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Hue wheel + SV triangle logic
        InvisibleButton("hsv", ImVec2(sv_picker_size + style.ItemInnerSpacing.x + bars_width, sv_picker_size));
        if (IsItemActive())
        {
            ImVec2 initial_off = g.IO.MouseClickedPos[0] - wheel_center;
            ImVec2 current_off = g.IO.MousePos - wheel_center;
            float initial_dist2 = ImLengthSqr(initial_off);
            if (initial_dist2 >= (wheel_r_inner-1)*(wheel_r_inner-1) && initial_dist2 <= (wheel_r_outer+1)*(wheel_r_outer+1))
            {
                // Interactive with Hue wheel
                H = ImAtan2(current_off.y, current_off.x) / IM_PI*0.5f;
                if (H < 0.0f)
                    H += 1.0f;
                value_changed = value_changed_h = true;
            }
            float cos_hue_angle = ImCos(-H * 2.0f * IM_PI);
            float sin_hue_angle = ImSin(-H * 2.0f * IM_PI);
            if (ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, ImRotate(initial_off, cos_hue_angle, sin_hue_angle)))
            {
                // Interacting with SV triangle
                ImVec2 current_off_unrotated = ImRotate(current_off, cos_hue_angle, sin_hue_angle);
                if (!ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated))
                    current_off_unrotated = ImTriangleClosestPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated);
                float uu, vv, ww;
                ImTriangleBarycentricCoords(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated, uu, vv, ww);
                V = ImClamp(1.0f - vv, 0.0001f, 1.0f);
                S = ImClamp(uu / V, 0.0001f, 1.0f);
                value_changed = value_changed_sv = true;
            }
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // SV rectangle logic
        InvisibleButton("sv", ImVec2(sv_picker_size, sv_picker_size));
        if (IsItemActive())
        {
            S = ImSaturate((io.MousePos.x - picker_pos.x) / (sv_picker_size-1));
            V = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = value_changed_sv = true;
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");

        // Hue bar logic
        SetCursorScreenPos(ImVec2(bar0_pos_x, picker_pos.y));
        InvisibleButton("hue", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            H = ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = value_changed_h = true;
        }
    }

    // Alpha bar logic
    if (alpha_bar)
    {
        SetCursorScreenPos(ImVec2(bar1_pos_x, picker_pos.y));
        InvisibleButton("alpha", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            col[3] = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = true;
        }
    }
    PopItemFlag(); // ImGuiItemFlags_NoNav

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        SameLine(0, style.ItemInnerSpacing.x);
        BeginGroup();
    }

    if (!(flags & ImGuiColorEditFlags_NoLabel))
    {
        const char* label_display_end = FindRenderedTextEnd(label);
        if (label != label_display_end)
        {
            if ((flags & ImGuiColorEditFlags_NoSidePreview))
                SameLine(0, style.ItemInnerSpacing.x);
            TextUnformatted(label, label_display_end);
        }
    }

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        PushItemFlag(ImGuiItemFlags_NoNavDefaultFocus, true);
        ImVec4 col_v4(col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
        if ((flags & ImGuiColorEditFlags_NoLabel))
            Text("Current");
        ColorButton("##current", col_v4, (flags & (ImGuiColorEditFlags_HDR|ImGuiColorEditFlags_AlphaPreview|ImGuiColorEditFlags_AlphaPreviewHalf|ImGuiColorEditFlags_NoTooltip)), ImVec2(square_sz * 3, square_sz * 2));
        if (ref_col != NULL)
        {
            Text("Original");
            ImVec4 ref_col_v4(ref_col[0], ref_col[1], ref_col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : ref_col[3]);
            if (ColorButton("##original", ref_col_v4, (flags & (ImGuiColorEditFlags_HDR|ImGuiColorEditFlags_AlphaPreview|ImGuiColorEditFlags_AlphaPreviewHalf|ImGuiColorEditFlags_NoTooltip)), ImVec2(square_sz * 3, square_sz * 2)))
            {
                memcpy(col, ref_col, components * sizeof(float));
                value_changed = true;
            }
        }
        PopItemFlag();
        EndGroup();
    }

    // Convert back color to RGB
    if (value_changed_h || value_changed_sv)
        ColorConvertHSVtoRGB(H >= 1.0f ? H - 10 * 1e-6f : H, S > 0.0f ? S : 10*1e-6f, V > 0.0f ? V : 1e-6f, col[0], col[1], col[2]);

    // R,G,B and H,S,V slider color editor
    if ((flags & ImGuiColorEditFlags_NoInputs) == 0)
    {
        PushItemWidth((alpha_bar ? bar1_pos_x : bar0_pos_x) + bars_width - picker_pos.x);
        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags__DataTypeMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_NoOptions | ImGuiColorEditFlags_NoSmallPreview | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf;
        ImGuiColorEditFlags sub_flags = (flags & sub_flags_to_forward) | ImGuiColorEditFlags_NoPicker;
        if (flags & ImGuiColorEditFlags_RGB || (flags & ImGuiColorEditFlags__InputsMask) == 0)
            value_changed |= ColorEdit4("##rgb", col, sub_flags | ImGuiColorEditFlags_RGB);
        if (flags & ImGuiColorEditFlags_HSV || (flags & ImGuiColorEditFlags__InputsMask) == 0)
            value_changed |= ColorEdit4("##hsv", col, sub_flags | ImGuiColorEditFlags_HSV);
        if (flags & ImGuiColorEditFlags_HEX || (flags & ImGuiColorEditFlags__InputsMask) == 0)
            value_changed |= ColorEdit4("##hex", col, sub_flags | ImGuiColorEditFlags_HEX);
        PopItemWidth();
    }

    // Try to cancel hue wrap (after ColorEdit), if any
    if (value_changed)
    {
        float new_H, new_S, new_V;
        ColorConvertRGBtoHSV(col[0], col[1], col[2], new_H, new_S, new_V);
        if (new_H <= 0 && H > 0)
        {
            if (new_V <= 0 && V != new_V)
                ColorConvertHSVtoRGB(H, S, new_V <= 0 ? V * 0.5f : new_V, col[0], col[1], col[2]);
            else if (new_S <= 0)
                ColorConvertHSVtoRGB(H, new_S <= 0 ? S * 0.5f : new_S, new_V, col[0], col[1], col[2]);
        }
    }

    ImVec4 hue_color_f(1, 1, 1, 1); ColorConvertHSVtoRGB(H, 1, 1, hue_color_f.x, hue_color_f.y, hue_color_f.z);
    ImU32 hue_color32 = ColorConvertFloat4ToU32(hue_color_f);
    ImU32 col32_no_alpha = ColorConvertFloat4ToU32(ImVec4(col[0], col[1], col[2], 1.0f));

    const ImU32 hue_colors[6+1] = { IM_COL32(255,0,0,255), IM_COL32(255,255,0,255), IM_COL32(0,255,0,255), IM_COL32(0,255,255,255), IM_COL32(0,0,255,255), IM_COL32(255,0,255,255), IM_COL32(255,0,0,255) };
    ImVec2 sv_cursor_pos;

    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Render Hue Wheel
        const float aeps = 1.5f / wheel_r_outer; // Half a pixel arc length in radians (2pi cancels out).
        const int segment_per_arc = ImMax(4, (int)wheel_r_outer / 12);
        for (int n = 0; n < 6; n++)
        {
            const float a0 = (n)     /6.0f * 2.0f * IM_PI - aeps;
            const float a1 = (n+1.0f)/6.0f * 2.0f * IM_PI + aeps;
            const int vert_start_idx = draw_list->VtxBuffer.Size;
            draw_list->PathArcTo(wheel_center, (wheel_r_inner + wheel_r_outer)*0.5f, a0, a1, segment_per_arc);
            draw_list->PathStroke(IM_COL32_WHITE, false, wheel_thickness);
            const int vert_end_idx = draw_list->VtxBuffer.Size;

            // Paint colors over existing vertices
            ImVec2 gradient_p0(wheel_center.x + ImCos(a0) * wheel_r_inner, wheel_center.y + ImSin(a0) * wheel_r_inner);
            ImVec2 gradient_p1(wheel_center.x + ImCos(a1) * wheel_r_inner, wheel_center.y + ImSin(a1) * wheel_r_inner);
            ShadeVertsLinearColorGradientKeepAlpha(draw_list->VtxBuffer.Data + vert_start_idx, draw_list->VtxBuffer.Data + vert_end_idx, gradient_p0, gradient_p1, hue_colors[n], hue_colors[n+1]);
        }

        // Render Cursor + preview on Hue Wheel
        float cos_hue_angle = ImCos(H * 2.0f * IM_PI);
        float sin_hue_angle = ImSin(H * 2.0f * IM_PI);
        ImVec2 hue_cursor_pos(wheel_center.x + cos_hue_angle * (wheel_r_inner+wheel_r_outer)*0.5f, wheel_center.y + sin_hue_angle * (wheel_r_inner+wheel_r_outer)*0.5f);
        float hue_cursor_rad = value_changed_h ? wheel_thickness * 0.65f : wheel_thickness * 0.55f;
        int hue_cursor_segments = ImClamp((int)(hue_cursor_rad / 1.4f), 9, 32);
        draw_list->AddCircleFilled(hue_cursor_pos, hue_cursor_rad, hue_color32, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad+1, IM_COL32(128,128,128,255), hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad, IM_COL32_WHITE, hue_cursor_segments);

        // Render SV triangle (rotated according to hue)
        ImVec2 tra = wheel_center + ImRotate(triangle_pa, cos_hue_angle, sin_hue_angle);
        ImVec2 trb = wheel_center + ImRotate(triangle_pb, cos_hue_angle, sin_hue_angle);
        ImVec2 trc = wheel_center + ImRotate(triangle_pc, cos_hue_angle, sin_hue_angle);
        ImVec2 uv_white = GetFontTexUvWhitePixel();
        draw_list->PrimReserve(6, 6);
        draw_list->PrimVtx(tra, uv_white, hue_color32);
        draw_list->PrimVtx(trb, uv_white, hue_color32);
        draw_list->PrimVtx(trc, uv_white, IM_COL32_WHITE);
        draw_list->PrimVtx(tra, uv_white, IM_COL32_BLACK_TRANS);
        draw_list->PrimVtx(trb, uv_white, IM_COL32_BLACK);
        draw_list->PrimVtx(trc, uv_white, IM_COL32_BLACK_TRANS);
        draw_list->AddTriangle(tra, trb, trc, IM_COL32(128,128,128,255), 1.5f);
        sv_cursor_pos = ImLerp(ImLerp(trc, tra, ImSaturate(S)), trb, ImSaturate(1 - V));
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // Render SV Square
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size,sv_picker_size), IM_COL32_WHITE, hue_color32, hue_color32, IM_COL32_WHITE);
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size,sv_picker_size), IM_COL32_BLACK_TRANS, IM_COL32_BLACK_TRANS, IM_COL32_BLACK, IM_COL32_BLACK);
        RenderFrameBorder(picker_pos, picker_pos + ImVec2(sv_picker_size,sv_picker_size), 0.0f);
        sv_cursor_pos.x = ImClamp((float)(int)(picker_pos.x + ImSaturate(S)     * sv_picker_size + 0.5f), picker_pos.x + 2, picker_pos.x + sv_picker_size - 2); // Sneakily prevent the circle to stick out too much
        sv_cursor_pos.y = ImClamp((float)(int)(picker_pos.y + ImSaturate(1 - V) * sv_picker_size + 0.5f), picker_pos.y + 2, picker_pos.y + sv_picker_size - 2);

        // Render Hue Bar
        for (int i = 0; i < 6; ++i)
            draw_list->AddRectFilledMultiColor(ImVec2(bar0_pos_x, picker_pos.y + i * (sv_picker_size / 6)), ImVec2(bar0_pos_x + bars_width, picker_pos.y + (i + 1) * (sv_picker_size / 6)), hue_colors[i], hue_colors[i], hue_colors[i + 1], hue_colors[i + 1]);
        float bar0_line_y = (float)(int)(picker_pos.y + H * sv_picker_size + 0.5f);
        RenderFrameBorder(ImVec2(bar0_pos_x, picker_pos.y), ImVec2(bar0_pos_x + bars_width, picker_pos.y + sv_picker_size), 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar0_pos_x - 1, bar0_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f);
    }

    // Render cursor/preview circle (clamp S/V within 0..1 range because floating points colors may lead HSV values to be out of range)
    float sv_cursor_rad = value_changed_sv ? 10.0f : 6.0f;
    draw_list->AddCircleFilled(sv_cursor_pos, sv_cursor_rad, col32_no_alpha, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad+1, IM_COL32(128,128,128,255), 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad, IM_COL32_WHITE, 12);

    // Render alpha bar
    if (alpha_bar)
    {
        float alpha = ImSaturate(col[3]);
        ImRect bar1_bb(bar1_pos_x, picker_pos.y, bar1_pos_x + bars_width, picker_pos.y + sv_picker_size);
        RenderColorRectWithAlphaCheckerboard(bar1_bb.Min, bar1_bb.Max, IM_COL32(0,0,0,0), bar1_bb.GetWidth() / 2.0f, ImVec2(0.0f, 0.0f));
        draw_list->AddRectFilledMultiColor(bar1_bb.Min, bar1_bb.Max, col32_no_alpha, col32_no_alpha, col32_no_alpha & ~IM_COL32_A_MASK, col32_no_alpha & ~IM_COL32_A_MASK);
        float bar1_line_y = (float)(int)(picker_pos.y + (1.0f - alpha) * sv_picker_size + 0.5f);
        RenderFrameBorder(bar1_bb.Min, bar1_bb.Max, 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar1_pos_x - 1, bar1_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f);
    }

    EndGroup();
    PopID();

    return value_changed && memcmp(backup_initial_col, col, components * sizeof(float));
}